

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::LoadableGetStateBlock_w
          (ChNodeFEAxyzDDD *this,int block_offset,ChStateDelta *mDDD)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  Index index_3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (block_offset < 0) goto LAB_0065823c;
  lVar3 = (mDDD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < block_offset) goto LAB_0065823c;
  pdVar2 = (mDDD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar1 = pdVar2 + block_offset;
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_006580bc;
  }
  else {
LAB_006580bc:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar6 - 0x10];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar4 - 0x10];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar4 = (ulong)(uint)block_offset;
  if (lVar3 < (long)(uVar4 + 3)) goto LAB_0065823c;
  pdVar1 = pdVar2 + uVar4 + 3;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar6 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0065812b;
  }
  else {
LAB_0065812b:
    uVar7 = 0;
    do {
      pdVar1[uVar7] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar3 < (long)(uVar4 + 6)) goto LAB_0065823c;
  pdVar1 = pdVar2 + uVar4 + 6;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar6 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0065819e;
  }
  else {
LAB_0065819e:
    uVar7 = 0;
    do {
      pdVar1[uVar7] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar3 < (long)(uVar4 + 9)) {
LAB_0065823c:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar2 = pdVar2 + uVar4 + 9;
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_0065821d;
  }
  uVar6 = 0;
  do {
    pdVar2[uVar6] = (this->DDD_dt).m_data[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_0065821d:
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = (this->DDD_dt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

virtual void LoadableGetStateBlock_w(int block_offset, ChStateDelta& mDDD) override {
        mDDD.segment(block_offset + 0, 3) = pos_dt.eigen();
        mDDD.segment(block_offset + 3, 3) = D_dt.eigen();
        mDDD.segment(block_offset + 6, 3) = DD_dt.eigen();
        mDDD.segment(block_offset + 9, 3) = DDD_dt.eigen();
    }